

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void writeProperty(FILE *fout,string *targetName,string *prop,string *value)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (targetName->_M_dataplus)._M_p;
  cmOutputConverter::EscapeForCMake(&local_60,prop);
  cmOutputConverter::EscapeForCMake(&local_40,value);
  fprintf((FILE *)fout,"set_property(TARGET %s PROPERTY %s %s)\n",pcVar1,local_60._M_dataplus._M_p,
          local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

static void writeProperty(FILE* fout, std::string const& targetName,
                          std::string const& prop, std::string const& value)
{
  fprintf(fout, "set_property(TARGET %s PROPERTY %s %s)\n", targetName.c_str(),
          cmOutputConverter::EscapeForCMake(prop).c_str(),
          cmOutputConverter::EscapeForCMake(value).c_str());
}